

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_expr_sub(CPState *cp,CPValue *k,int pri)

{
  undefined4 in_EDX;
  CPState *in_RSI;
  CPValue *in_stack_00000018;
  CPState *in_stack_00000020;
  undefined4 in_stack_ffffffffffffffe8;
  
  cp_expr_unary(in_RSI,(CPValue *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  cp_expr_infix(in_stack_00000020,in_stack_00000018,cp._4_4_);
  return;
}

Assistant:

static void cp_expr_sub(CPState *cp, CPValue *k, int pri)
{
  cp_expr_unary(cp, k);
  cp_expr_infix(cp, k, pri);
}